

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

void mg_send_mime_file2(mg_connection *conn,char *path,char *mime_type,char *additional_headers)

{
  byte bVar1;
  mg_domain_context *pmVar2;
  bool bVar3;
  size_t dst_len;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  ulong uVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  __int32_t **pp_Var12;
  DIR *__dirp;
  dirent64 *pdVar13;
  ptrdiff_t pVar14;
  undefined8 *puVar15;
  size_t sVar16;
  char *pcVar17;
  int *piVar18;
  long lVar19;
  size_t sVar20;
  tm *__tp;
  int iVar21;
  mg_match_context *mcx;
  time_t *extraout_RDX;
  mg_file_stat *filep;
  char *func;
  mg_context *ctx;
  time_t *extraout_RDX_00;
  time_t *t;
  char *pcVar22;
  char *pcVar23;
  long lVar24;
  ulong uVar25;
  void *cmp;
  char *pcVar26;
  ulong uVar27;
  undefined8 *puVar28;
  ulong uVar29;
  ulong uVar30;
  bool bVar31;
  double dVar32;
  undefined1 auVar33 [16];
  ulong local_1178;
  undefined8 *local_1170;
  ulong local_1168;
  int local_115c;
  undefined8 *local_1158;
  undefined8 *local_1150;
  ulong local_1148;
  undefined8 *local_1140;
  undefined8 *local_1138;
  ulong local_1130;
  long local_1128;
  ulong local_1120;
  char *local_1118;
  long local_1110;
  ulong local_1108;
  long local_1100;
  ulong local_10f8;
  time_t local_10f0;
  mg_file file;
  de de;
  char date [64];
  char path_1 [4096];
  
  file.stat.is_directory = 0;
  file.stat.is_gzipped = 0;
  file.stat.location = 0;
  file.stat._28_4_ = 0;
  file.stat.size = 0;
  file.stat.last_modified = 0;
  file.access.fp = (FILE *)0x0;
  if (conn == (mg_connection *)0x0) {
    return;
  }
  iVar10 = mg_stat((mg_connection *)path,(char *)&file,(mg_file_stat *)mime_type);
  if (iVar10 == 0) {
    pcVar22 = "Error: File not found";
    iVar10 = 0x194;
LAB_001101c9:
    mg_send_http_error(conn,iVar10,"%s",pcVar22);
    return;
  }
  if (file.stat.is_directory == 0) {
    handle_static_file_request(conn,path,&file,mime_type,additional_headers);
    return;
  }
  pcVar22 = conn->dom_ctx->config[0x21];
  pp_Var12 = __ctype_tolower_loc();
  mcx = (mg_match_context *)0x0;
  do {
    bVar1 = pcVar22[(long)mcx];
    iVar10 = (*pp_Var12)[bVar1];
    iVar11 = (*pp_Var12)[*(byte *)((long)&mcx[0x915].match[10].str + 7)];
    if (bVar1 == 0) break;
    mcx = (mg_match_context *)((long)&mcx->case_sensitive + 1);
  } while (iVar10 == iVar11);
  if (iVar10 != iVar11) {
    pcVar22 = "Error: Directory listing denied";
    iVar10 = 0x193;
    goto LAB_001101c9;
  }
  local_1170 = (undefined8 *)0x0;
  local_10f0 = time((time_t *)0x0);
  __dirp = opendir(path);
  if (__dirp == (DIR *)0x0) {
    local_1178 = 0;
    t = extraout_RDX;
  }
  else {
    pdVar13 = readdir64(__dirp);
    if (pdVar13 == (dirent64 *)0x0) {
      local_1178 = 0;
      local_1170 = (undefined8 *)0x0;
    }
    else {
      local_1168 = 0x80;
      local_1178 = 0;
      local_1170 = (undefined8 *)0x0;
      do {
        pcVar22 = pdVar13->d_name;
        iVar10 = strcmp(pcVar22,".");
        if (((iVar10 != 0) && (iVar10 = strcmp(pcVar22,".."), iVar10 != 0)) &&
           ((pmVar2 = conn->dom_ctx, pmVar2 == (mg_domain_context *)0x0 ||
            ((pVar14 = mg_match_alternatives("**.htpasswd$",0xc,pcVar22,mcx), pVar14 < 1 &&
             (pVar14 = match_prefix_strlen(pmVar2->config[0x2a],pcVar22), pVar14 < 1)))))) {
          mcx = (mg_match_context *)0x1000;
          mg_snprintf(conn,&local_115c,path_1,0x1000,"%s/%s",path,pcVar22);
          de.file.is_directory = 0;
          de.file.is_gzipped = 0;
          de.file.location = 0;
          de.file._28_4_ = 0;
          de.file.size = 0;
          de.file.last_modified = 0;
          if (local_115c == 0) {
            iVar10 = mg_stat((mg_connection *)path_1,(char *)&de.file,filep);
            if (iVar10 == 0) {
              piVar18 = __errno_location();
              mcx = (mg_match_context *)strerror(*piVar18);
              mg_cry_internal_wrap
                        (conn,(mg_context *)0x0,func,(uint)mcx,"%s: mg_stat(%s) failed: %s",
                         "scan_directory",(mg_connection *)path_1,mcx);
            }
            de.file_name = pcVar22;
            if ((local_1170 == (undefined8 *)0x0) || (local_1168 <= local_1178)) {
              puVar15 = (undefined8 *)realloc(local_1170,local_1168 * 0x50);
              if (puVar15 != (undefined8 *)0x0) {
                local_1168 = local_1168 * 2;
                local_1170 = puVar15;
                goto LAB_001100fb;
              }
LAB_00110156:
              bVar3 = false;
            }
            else {
LAB_001100fb:
              pcVar22 = de.file_name;
              sVar16 = strlen(de.file_name);
              pcVar22 = mg_strndup_ctx(pcVar22,sVar16,ctx);
              mcx = (mg_match_context *)(local_1178 * 5);
              local_1170[local_1178 * 5] = pcVar22;
              if (pcVar22 == (char *)0x0) goto LAB_00110156;
              local_1170[local_1178 * 5 + 3] = de.file._16_8_;
              (local_1170 + local_1178 * 5 + 3)[1] = de.file._24_8_;
              local_1170[local_1178 * 5 + 1] = de.file.size;
              (local_1170 + local_1178 * 5 + 1)[1] = de.file.last_modified;
              local_1178 = local_1178 + 1;
              bVar3 = true;
            }
            if (!bVar3) break;
          }
        }
        pdVar13 = readdir64(__dirp);
      } while (pdVar13 != (dirent64 *)0x0);
    }
    closedir(__dirp);
    t = extraout_RDX_00;
  }
  if (__dirp == (DIR *)0x0) {
    piVar18 = __errno_location();
    pcVar22 = strerror(*piVar18);
    mg_send_http_error(conn,500,"Error: Cannot open directory\nopendir(%s): %s",path,pcVar22);
    return;
  }
  gmt_time_string(date,(size_t)&local_10f0,t);
  pcVar22 = (conn->request_info).local_uri;
  sVar16 = strcspn(pcVar22,"&<>");
  if (pcVar22[sVar16] != '\0') {
    sVar16 = strlen(pcVar22);
    pcVar17 = (char *)malloc(sVar16 * 5 + 1);
    if (pcVar17 != (char *)0x0) {
      cVar9 = *pcVar22;
      pcVar23 = pcVar22;
      pcVar26 = pcVar17;
      while (cVar9 != '\0') {
        pcVar23 = pcVar23 + 1;
        *pcVar26 = cVar9;
        pcVar26[1] = '\0';
        if (cVar9 == '>') {
          builtin_strncpy(pcVar26,"&gt;",5);
        }
        else if (cVar9 == '<') {
          builtin_strncpy(pcVar26,"&lt;",5);
        }
        else if (cVar9 == '&') {
          builtin_strncpy(pcVar26,"&amp;",6);
        }
        sVar16 = strlen(pcVar26);
        pcVar26 = pcVar26 + sVar16;
        cVar9 = *pcVar23;
      }
      goto LAB_00110318;
    }
    pcVar22 = "";
  }
  pcVar17 = (char *)0x0;
LAB_00110318:
  pcVar23 = (conn->request_info).query_string;
  uVar27 = 100;
  if ((pcVar23 != (char *)0x0) && (*pcVar23 != '\0')) {
    uVar27 = (ulong)((uint)(pcVar23[1] != 'd') * 3 + 0x61);
  }
  conn->must_close = 1;
  mg_response_header_start(conn,200);
  send_no_cache_header(conn);
  pcVar23 = conn->dom_ctx->config[0x38];
  if ((pcVar23 != (char *)0x0) && (*pcVar23 != '\0')) {
    mg_response_header_add_lines(conn,pcVar23);
  }
  mg_response_header_add(conn,"Content-Type","text/html; charset=utf-8",-1);
  mg_response_header_send(conn);
  if (pcVar17 != (char *)0x0) {
    pcVar22 = pcVar17;
  }
  mg_printf(conn,
            "<!DOCTYPE html><html><head><title>Index of %s</title><style>th {text-align: left;}</style></head><body><h1>Index of %s</h1><pre><table cellpadding=\"0\"><tr><th><a href=\"?n%c\">Name</a></th><th><a href=\"?d%c\">Modified</a></th><th><a href=\"?s%c\">Size</a></th></tr><tr><td colspan=\"3\"><hr></td></tr>"
            ,pcVar22,pcVar22,uVar27,uVar27,uVar27);
  free(pcVar17);
  mg_printf(conn,"<tr><td><a href=\"%s\">%s</a></td><td>&nbsp;%s</td><td>&nbsp;&nbsp;%s</td></tr>\n"
            ,"..","Parent directory","-","-");
  if (local_1170 != (undefined8 *)0x0) {
    pcVar22 = (conn->request_info).query_string;
    local_1130 = local_1178 >> 1;
    if (pcVar22 == (char *)0x0) {
      pcVar22 = "";
    }
    lVar19 = 8;
    local_1118 = pcVar22;
    do {
      uVar27 = *(ulong *)(&DAT_0012b5a0 + lVar19 * 8);
      local_1128 = lVar19;
      if (uVar27 <= local_1130) {
        local_1120 = uVar27 + (uVar27 == 0);
        lVar19 = uVar27 * 0x28;
        local_1150 = local_1170 + uVar27 * -5;
        uVar25 = 0;
        local_1158 = local_1170;
        local_1110 = lVar19;
        local_1108 = uVar27;
        do {
          local_1148 = uVar25;
          if (uVar25 < local_1178) {
            local_1138 = local_1150;
            local_1140 = local_1158;
            do {
              pcVar17 = (char *)local_1170[uVar25 * 5];
              uVar29 = local_1170[uVar25 * 5 + 1];
              lVar24 = local_1170[uVar25 * 5 + 2];
              iVar10 = *(int *)(local_1170 + uVar25 * 5 + 3);
              path_1._8_4_ = *(undefined4 *)((long)local_1170 + uVar25 * 0x28 + 0x24);
              path_1._0_8_ = *(undefined8 *)((long)local_1170 + uVar25 * 0x28 + 0x1c);
              puVar15 = local_1138;
              puVar28 = local_1140;
              uVar30 = uVar25;
              lVar7 = lVar24;
              uVar8 = uVar29;
              if (uVar27 <= uVar25) {
                do {
                  local_10f8 = uVar8;
                  local_1100 = lVar7;
                  if (puVar15 == (undefined8 *)0x0) break;
                  pcVar23 = pcVar22;
                  if (*pcVar22 == '\0') {
                    pcVar23 = "n";
                  }
                  if (*(int *)(puVar15 + 3) == 0) {
                    if (iVar10 == 0) goto LAB_00110542;
                  }
                  else {
                    if (iVar10 == 0) break;
LAB_00110542:
                    if (*pcVar23 == 'd') {
                      bVar31 = puVar15[2] == lVar24;
                      bVar3 = !bVar31 && lVar24 <= (long)puVar15[2];
LAB_0011056d:
                      iVar11 = (uint)bVar3 * 2 + -1;
                      if (bVar31) {
                        iVar11 = 0;
                      }
                    }
                    else {
                      iVar11 = 0;
                      if (*pcVar23 == 's') {
                        bVar31 = puVar15[1] == uVar29;
                        bVar3 = uVar29 < (ulong)puVar15[1];
                        goto LAB_0011056d;
                      }
                    }
                    if (iVar11 == 0) {
                      iVar11 = strcmp((char *)*puVar15,pcVar17);
                      pcVar22 = local_1118;
                      lVar24 = local_1100;
                      lVar19 = local_1110;
                      uVar27 = local_1108;
                      uVar29 = local_10f8;
                    }
                    iVar21 = -iVar11;
                    if (pcVar23[1] != 'd') {
                      iVar21 = iVar11;
                    }
                    if (iVar21 < 1) break;
                  }
                  uVar30 = uVar30 - uVar27;
                  puVar28[4] = puVar15[4];
                  uVar5 = *puVar15;
                  uVar6 = puVar15[1];
                  uVar4 = puVar15[3];
                  puVar28[2] = puVar15[2];
                  puVar28[3] = uVar4;
                  *puVar28 = uVar5;
                  puVar28[1] = uVar6;
                  puVar15 = (undefined8 *)((long)puVar15 - lVar19);
                  puVar28 = (undefined8 *)((long)puVar28 - lVar19);
                  lVar7 = local_1100;
                  uVar8 = local_10f8;
                } while (uVar27 <= uVar30);
              }
              local_1170[uVar30 * 5] = pcVar17;
              local_1170[uVar30 * 5 + 1] = uVar29;
              local_1170[uVar30 * 5 + 2] = lVar24;
              *(int *)(local_1170 + uVar30 * 5 + 3) = iVar10;
              *(undefined8 *)((long)local_1170 + uVar30 * 0x28 + 0x1c) = path_1._0_8_;
              *(undefined4 *)((long)local_1170 + uVar30 * 0x28 + 0x24) = path_1._8_4_;
              uVar25 = uVar25 + uVar27;
              local_1140 = (undefined8 *)((long)local_1140 + lVar19);
              local_1138 = (undefined8 *)((long)local_1138 + lVar19);
            } while (uVar25 < local_1178);
          }
          uVar25 = local_1148 + 1;
          local_1158 = local_1158 + 5;
          local_1150 = local_1150 + 5;
        } while (uVar25 != local_1120);
      }
      lVar19 = local_1128 + -1;
    } while (local_1128 != 0);
    if (local_1178 != 0) {
      uVar27 = 0;
      do {
        puVar15 = local_1170 + uVar27 * 5;
        pcVar22 = (char *)*puVar15;
        sVar16 = strlen(pcVar22);
        sVar20 = strcspn(pcVar22,"&<>");
        lVar19 = 0;
        if (pcVar22[sVar20] != '\0') {
          lVar19 = (sVar16 + 1) * 5;
        }
        dst_len = (sVar16 + 1) * 3;
        pcVar17 = (char *)malloc(lVar19 + dst_len);
        if (pcVar17 != (char *)0x0) {
          mg_url_encode(pcVar22,pcVar17,dst_len);
          if (lVar19 == 0) {
            pcVar22 = (char *)0x0;
          }
          else {
            pcVar22 = pcVar17 + dst_len;
            pcVar23 = (char *)*puVar15;
            cVar9 = *pcVar23;
            pcVar26 = pcVar22;
            while (cVar9 != '\0') {
              pcVar23 = pcVar23 + 1;
              *pcVar26 = cVar9;
              pcVar26[1] = '\0';
              if (cVar9 == '>') {
                builtin_strncpy(pcVar26,"&gt;",5);
              }
              else if (cVar9 == '<') {
                builtin_strncpy(pcVar26,"&lt;",5);
              }
              else if (cVar9 == '&') {
                builtin_strncpy(pcVar26,"&amp;",6);
              }
              sVar16 = strlen(pcVar26);
              pcVar26 = pcVar26 + sVar16;
              cVar9 = *pcVar23;
            }
          }
          if (*(int *)(puVar15 + 3) == 0) {
            uVar25 = puVar15[1];
            if (uVar25 < 0x400) {
              mg_snprintf(conn,(int *)0x0,path_1,0x40,"%d");
            }
            else {
              if (uVar25 < 0x100000) {
                dVar32 = (double)(long)uVar25 * 0.0009765625;
                pcVar23 = "%.1fk";
              }
              else {
                auVar33._8_4_ = (int)(uVar25 >> 0x20);
                auVar33._0_8_ = uVar25;
                auVar33._12_4_ = 0x45300000;
                dVar32 = (auVar33._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)uVar25) - 4503599627370496.0);
                if (uVar25 < 0x40000000) {
                  dVar32 = dVar32 * 9.5367431640625e-07;
                  pcVar23 = "%.1fM";
                }
                else {
                  dVar32 = dVar32 * 9.313225746154785e-10;
                  pcVar23 = "%.1fG";
                }
              }
              mg_snprintf(conn,(int *)0x0,path_1,0x40,pcVar23,dVar32);
            }
          }
          else {
            mg_snprintf(conn,(int *)0x0,path_1,0x40,"%s","[DIRECTORY]");
          }
          __tp = localtime(puVar15 + 2);
          if (__tp == (tm *)0x0) {
            cVar9 = '0';
            lVar19 = 0;
            do {
              *(char *)((long)&de.file_name + lVar19) = cVar9;
              cVar9 = "01-Jan-1970 00:00"[lVar19 + 1];
              lVar19 = lVar19 + 1;
            } while (lVar19 != 0x11);
            de.file.last_modified._1_1_ = 0;
          }
          else {
            strftime((char *)&de,0x40,"%d-%b-%Y %H:%M",__tp);
          }
          pcVar23 = "/";
          if (*(int *)(puVar15 + 3) == 0) {
            pcVar23 = "";
          }
          if (pcVar22 == (char *)0x0) {
            pcVar22 = (char *)*puVar15;
          }
          mg_printf(conn,
                    "<tr><td><a href=\"%s%s\">%s%s</a></td><td>&nbsp;%s</td><td>&nbsp;&nbsp;%s</td></tr>\n"
                    ,pcVar17,pcVar23,pcVar22,pcVar23,&de,path_1);
          free(pcVar17);
        }
        free((void *)*puVar15);
        uVar27 = uVar27 + 1;
      } while (uVar27 != local_1178);
    }
    free(local_1170);
  }
  mg_printf(conn,"%s","</table></pre></body></html>");
  conn->status_code = 200;
  return;
}

Assistant:

CIVETWEB_API void
mg_send_mime_file2(struct mg_connection *conn,
                   const char *path,
                   const char *mime_type,
                   const char *additional_headers)
{
	struct mg_file file = STRUCT_FILE_INITIALIZER;

	if (!conn) {
		/* No conn */
		return;
	}

	if (mg_stat(conn, path, &file.stat)) {
#if !defined(NO_CACHING)
		if (is_not_modified(conn, &file.stat)) {
			/* Send 304 "Not Modified" - this must not send any body data */
			handle_not_modified_static_file_request(conn, &file);
		} else
#endif /* NO_CACHING */
		    if (file.stat.is_directory) {
			if (!mg_strcasecmp(conn->dom_ctx->config[ENABLE_DIRECTORY_LISTING],
			                   "yes")) {
				handle_directory_request(conn, path);
			} else {
				mg_send_http_error(conn,
				                   403,
				                   "%s",
				                   "Error: Directory listing denied");
			}
		} else {
			handle_static_file_request(
			    conn, path, &file, mime_type, additional_headers);
		}
	} else {
		mg_send_http_error(conn, 404, "%s", "Error: File not found");
	}
}